

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall
kj::_::BTreeImpl::rotateLeft
          (BTreeImpl *this,Leaf *left,Leaf *right,Parent *parent,uint indexInParent,
          MaybeUint **fixup)

{
  bool bVar1;
  size_t mid;
  Fault f_1;
  Fault local_40;
  Fault f;
  MaybeUint **fixup_local;
  uint indexInParent_local;
  Parent *parent_local;
  Leaf *right_local;
  Leaf *left_local;
  BTreeImpl *this_local;
  
  f.exception = (Exception *)fixup;
  bVar1 = Leaf::isHalfFull(left);
  if (!bVar1) {
    Debug::Fault::Fault(&local_40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                        ,0x2d5,FAILED,"left.isHalfFull()","");
    Debug::Fault::fatal(&local_40);
  }
  bVar1 = Leaf::isMostlyFull(right);
  if (!bVar1) {
    Debug::Fault::Fault((Fault *)&mid,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                        ,0x2d6,FAILED,"right.isMostlyFull()","");
    Debug::Fault::fatal((Fault *)&mid);
  }
  left->rows[7].i = right->rows[0].i;
  parent->keys[indexInParent].i = left->rows[7].i;
  if ((MaybeUint *)((f.exception)->ownFile).content.ptr == parent->keys + indexInParent) {
    ((f.exception)->ownFile).content.ptr = (char *)0x0;
  }
  amove<kj::_::BTreeImpl::MaybeUint>(right->rows,right->rows + 1,0xd);
  MaybeUint::operator=(right->rows + 0xd,(void *)0x0);
  return;
}

Assistant:

void BTreeImpl::rotateLeft(
    Leaf& left, Leaf& right, Parent& parent, uint indexInParent, MaybeUint*& fixup) {
  // Steal one item from the right node and move it to the left node.

  // Like merge(), this is only called on an exactly-half-empty node.
  KJ_DASSERT(left.isHalfFull());
  KJ_DASSERT(right.isMostlyFull());

  constexpr size_t mid = Leaf::NROWS/2;
  parent.keys[indexInParent] = left.rows[mid] = right.rows[0];
  if (fixup == &parent.keys[indexInParent]) fixup = nullptr;
  amove(right.rows, right.rows + 1, Leaf::NROWS - 1);
  right.rows[Leaf::NROWS - 1] = nullptr;
}